

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

from_chars_result __thiscall semver::detail::lexer::scan_token(lexer *this,token_stream *stream)

{
  token_stream *ptVar1;
  bool bVar2;
  char *pcVar3;
  from_chars_result fVar4;
  _Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
  in_stack_ffffffffffffff48;
  range_operator local_89;
  variant<std::monostate,unsigned_char,char,semver::detail::range_operator> local_41 [2];
  uint8_t local_3f;
  variant<std::monostate,unsigned_char,char,semver::detail::range_operator> local_3e [2];
  range_operator local_3c;
  variant<std::monostate,unsigned_char,char,semver::detail::range_operator> local_3b [2];
  range_operator local_39;
  variant<std::monostate,unsigned_char,char,semver::detail::range_operator> local_38 [2];
  bool local_36;
  variant<std::monostate,unsigned_char,char,semver::detail::range_operator> local_35 [2];
  variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator> local_33;
  variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator> local_31;
  variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator> local_2f;
  variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator> local_2d;
  variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator> local_2b;
  char local_29;
  token_stream *ptStack_28;
  char c;
  token_stream *stream_local;
  lexer *this_local;
  errc local_10;
  
  ptStack_28 = stream;
  stream_local = (token_stream *)this;
  local_29 = advance(this);
  ptVar1 = ptStack_28;
  if (local_29 == ' ') {
    memset(&local_2b,0,2);
    std::variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>::variant
              (&local_2b);
    add_token(this,ptVar1,space,
              (value_t)in_stack_ffffffffffffff48.
                       super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
             );
  }
  else if (local_29 == '+') {
    memset(&local_31,0,2);
    std::variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>::variant
              (&local_31);
    add_token(this,ptVar1,plus,
              (value_t)in_stack_ffffffffffffff48.
                       super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
             );
  }
  else if (local_29 == '-') {
    memset(&local_2f,0,2);
    std::variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>::variant
              (&local_2f);
    add_token(this,ptVar1,hyphen,
              (value_t)in_stack_ffffffffffffff48.
                       super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
             );
  }
  else if (local_29 == '.') {
    memset(&local_2d,0,2);
    std::variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>::variant
              (&local_2d);
    add_token(this,ptVar1,dot,
              (value_t)in_stack_ffffffffffffff48.
                       super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
             );
  }
  else if (local_29 == '<') {
    local_36 = advanceIfMatch(this,'=');
    std::variant<std::monostate,unsigned_char,char,semver::detail::range_operator>::
    variant<semver::detail::range_operator,void,void,semver::detail::range_operator,void>
              (local_35,&local_36);
    add_token(this,ptVar1,range_operator,
              (value_t)in_stack_ffffffffffffff48.
                       super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
             );
  }
  else if (local_29 == '=') {
    local_3c = equal;
    std::variant<std::monostate,unsigned_char,char,semver::detail::range_operator>::
    variant<semver::detail::range_operator,void,void,semver::detail::range_operator,void>
              (local_3b,&local_3c);
    add_token(this,ptVar1,range_operator,
              (value_t)in_stack_ffffffffffffff48.
                       super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
             );
  }
  else if (local_29 == '>') {
    bVar2 = advanceIfMatch(this,'=');
    local_89 = greater_or_equal;
    if (!bVar2) {
      local_89 = greater;
    }
    local_39 = local_89;
    std::variant<std::monostate,unsigned_char,char,semver::detail::range_operator>::
    variant<semver::detail::range_operator,void,void,semver::detail::range_operator,void>
              (local_38,&local_39);
    add_token(this,ptVar1,range_operator,
              (value_t)in_stack_ffffffffffffff48.
                       super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
             );
  }
  else if (local_29 == '|') {
    bVar2 = advanceIfMatch(this,'|');
    ptVar1 = ptStack_28;
    if (!bVar2) {
      pcVar3 = get_prev_symbol(this);
      fVar4 = failure(pcVar3,invalid_argument);
      this_local = (lexer *)fVar4.super_from_chars_result.ptr;
      local_10 = fVar4.super_from_chars_result.ec;
      goto LAB_001d4c72;
    }
    memset(&local_33,0,2);
    std::variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>::variant
              (&local_33);
    add_token(this,ptVar1,logical_or,
              (value_t)in_stack_ffffffffffffff48.
                       super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       .
                       super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
             );
  }
  else {
    bVar2 = is_digit(local_29);
    ptVar1 = ptStack_28;
    if (bVar2) {
      local_3f = to_digit(local_29);
      std::variant<std::monostate,unsigned_char,char,semver::detail::range_operator>::
      variant<unsigned_char,void,void,unsigned_char,void>(local_3e,&local_3f);
      add_token(this,ptVar1,digit,
                (value_t)in_stack_ffffffffffffff48.
                         super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         .
                         super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         .
                         super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         .
                         super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
               );
    }
    else {
      bVar2 = is_letter(local_29);
      ptVar1 = ptStack_28;
      if (!bVar2) {
        pcVar3 = get_prev_symbol(this);
        fVar4 = failure(pcVar3,invalid_argument);
        this_local = (lexer *)fVar4.super_from_chars_result.ptr;
        local_10 = fVar4.super_from_chars_result.ec;
        goto LAB_001d4c72;
      }
      std::variant<std::monostate,unsigned_char,char,semver::detail::range_operator>::
      variant<char_const&,void,void,char,void>(local_41,&local_29);
      add_token(this,ptVar1,letter,
                (value_t)in_stack_ffffffffffffff48.
                         super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         .
                         super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         .
                         super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         .
                         super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
               );
    }
  }
  pcVar3 = get_prev_symbol(this);
  fVar4 = success(pcVar3);
  this_local = (lexer *)fVar4.super_from_chars_result.ptr;
  local_10 = fVar4.super_from_chars_result.ec;
LAB_001d4c72:
  fVar4.super_from_chars_result.ec = local_10;
  fVar4.super_from_chars_result.ptr = (char *)this_local;
  fVar4.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar4.super_from_chars_result;
}

Assistant:

scan_token(token_stream& stream) noexcept {
    const char c = advance();

    switch (c) {
    case ' ':
      add_token(stream, token_type::space);
      break;
    case '.':
      add_token(stream, token_type::dot);
      break;
    case '-':
      add_token(stream, token_type::hyphen);
      break;
    case '+':
      add_token(stream, token_type::plus);
      break;
    case '|':
      if (advanceIfMatch('|')) {
        add_token(stream, token_type::logical_or);
        break;
      }
      return failure(get_prev_symbol());
    case '<':
      add_token(stream, token_type::range_operator, advanceIfMatch('=') ? range_operator::less_or_equal : range_operator::less);
      break;
    case '>':
      add_token(stream, token_type::range_operator, advanceIfMatch('=') ? range_operator::greater_or_equal : range_operator::greater);
      break;
    case '=':
      add_token(stream, token_type::range_operator, range_operator::equal);
      break;
    default:
      if (is_digit(c)) {
        add_token(stream, token_type::digit, to_digit(c));
        break;
      }
      else if (is_letter(c)) {
        add_token(stream, token_type::letter, c);
        break;
      }
      return failure(get_prev_symbol());
    }

    return success(get_prev_symbol());
  }